

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::output_adapter(output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,basic_ostream<char,_std::char_traits<char>_> *s)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<nlohmann::detail::output_stream_adapter<char>,std::ostream&>
            ((basic_ostream<char,_std::char_traits<char>_> *)local_28);
  _Var1._M_pi = local_20._M_pi;
  (this->oa).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_28;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->oa).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  local_28 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

output_adapter(std::basic_ostream<CharType>& s)
        : oa(std::make_shared<output_stream_adapter<CharType>>(s)) {}